

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O0

Msat_Clause_t * Msat_SolverPropagate(Msat_Solver_t *p)

{
  int iVar1;
  int iVar2;
  int local_40;
  int nClauses;
  int j;
  int i;
  Msat_Lit_t Lit_out;
  Msat_Lit_t Lit;
  Msat_Clause_t *pConflict;
  Msat_Clause_t **pClauses;
  Msat_ClauseVec_t **pvWatched;
  Msat_Solver_t *p_local;
  
  pClauses = (Msat_Clause_t **)p->pvWatched;
  pvWatched = (Msat_ClauseVec_t **)p;
  do {
    i = Msat_QueueExtract((Msat_Queue_t *)pvWatched[0xb]);
    if (i < 0) {
      return (Msat_Clause_t *)0x0;
    }
    pvWatched[0x22] = (Msat_ClauseVec_t *)((long)&pvWatched[0x22]->pArray + 1);
    iVar1 = Msat_ClauseVecReadSize((Msat_ClauseVec_t *)pClauses[i]);
    pConflict = (Msat_Clause_t *)Msat_ClauseVecReadArray((Msat_ClauseVec_t *)pClauses[i]);
    local_40 = 0;
    for (nClauses = 0; nClauses < iVar1; nClauses = nClauses + 1) {
      pvWatched[0x23] = (Msat_ClauseVec_t *)((long)&pvWatched[0x23]->pArray + 1);
      j = -1;
      iVar2 = Msat_ClausePropagate((Msat_Clause_t *)pConflict[nClauses],i,(int *)pvWatched[0xd],&j);
      if (iVar2 == 0) {
        iVar2 = Msat_SolverEnqueue((Msat_Solver_t *)pvWatched,j,(Msat_Clause_t *)pConflict[nClauses]
                                  );
        if (iVar2 == 0) {
          _Lit_out = pConflict[nClauses];
          for (; nClauses < iVar1; nClauses = nClauses + 1) {
            pConflict[local_40] = pConflict[nClauses];
            local_40 = local_40 + 1;
          }
          Msat_ClauseVecShrink((Msat_ClauseVec_t *)pClauses[i],local_40);
          Msat_QueueClear((Msat_Queue_t *)pvWatched[0xb]);
          return (Msat_Clause_t *)_Lit_out;
        }
        pConflict[local_40] = pConflict[nClauses];
        local_40 = local_40 + 1;
      }
      else if (j < 0) {
        pConflict[local_40] = pConflict[nClauses];
        local_40 = local_40 + 1;
      }
      else {
        Msat_ClauseVecPush((Msat_ClauseVec_t *)pClauses[j],(Msat_Clause_t *)pConflict[nClauses]);
      }
    }
    Msat_ClauseVecShrink((Msat_ClauseVec_t *)pClauses[i],local_40);
  } while( true );
}

Assistant:

Msat_Clause_t * Msat_SolverPropagate( Msat_Solver_t * p )
{
    Msat_ClauseVec_t ** pvWatched = p->pvWatched;
    Msat_Clause_t ** pClauses;
    Msat_Clause_t * pConflict;
    Msat_Lit_t Lit, Lit_out;
    int i, j, nClauses;

    // propagate all the literals in the queue
    while ( (Lit = Msat_QueueExtract( p->pQueue )) >= 0 )
    {
        p->Stats.nPropagations++;
        // get the clauses watched by this literal
        nClauses = Msat_ClauseVecReadSize( pvWatched[Lit] );
        pClauses = Msat_ClauseVecReadArray( pvWatched[Lit] );
        // go through the watched clauses and decide what to do with them
        for ( i = j = 0; i < nClauses; i++ )
        {
            p->Stats.nInspects++;
            // clear the returned literal
            Lit_out = -1;
            // propagate the clause
            if ( !Msat_ClausePropagate( pClauses[i], Lit, p->pAssigns, &Lit_out ) )
            {   // the clause is unit
                // "Lit_out" contains the new assignment to be enqueued
                if ( Msat_SolverEnqueue( p, Lit_out, pClauses[i] ) ) 
                { // consistent assignment 
                    // no changes to the implication queue; the watch is the same too
                    pClauses[j++] = pClauses[i];
                    continue;
                }
                // remember the reason of conflict (will be returned)
                pConflict = pClauses[i];
                // leave the remaning clauses in the same watched list
                for ( ; i < nClauses; i++ )
                    pClauses[j++] = pClauses[i];
                Msat_ClauseVecShrink( pvWatched[Lit], j );
                // clear the propagation queue
                Msat_QueueClear( p->pQueue );
                return pConflict;
            }
            // the clause is not unit
            // in this case "Lit_out" contains the new watch if it has changed
            if ( Lit_out >= 0 )
                Msat_ClauseVecPush( pvWatched[Lit_out], pClauses[i] );
            else // the watch did not change
                pClauses[j++] = pClauses[i];
        }
        Msat_ClauseVecShrink( pvWatched[Lit], j );
    }
    return NULL;
}